

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarseparator.cpp
# Opt level: O2

void __thiscall QToolBarSeparator::paintEvent(QToolBarSeparator *this,QPaintEvent *param_1)

{
  long lVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QPainter p;
  QStyleOption opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,(QPaintDevice *)(this + 0x10));
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,1,0);
  initStyleOption(this,&opt);
  pQVar2 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar2 + 0xb0))
            (pQVar2,0x25,&opt,&p,*(undefined8 *)(*(long *)(this + 8) + 0x10));
  QStyleOption::~QStyleOption(&opt);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarSeparator::paintEvent(QPaintEvent *)
{
    QPainter p(this);
    QStyleOption opt;
    initStyleOption(&opt);
    style()->drawPrimitive(QStyle::PE_IndicatorToolBarSeparator, &opt, &p, parentWidget());
}